

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBBlendRow_SSSE3(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar20;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  undefined1 auVar21 [16];
  short sVar28;
  undefined1 auVar29 [16];
  
  auVar29[8] = 0xff;
  auVar29._0_8_ = 0xffffffffffffffff;
  auVar29[9] = 0xff;
  auVar29[10] = 0xff;
  auVar29[0xb] = 0xff;
  auVar29[0xc] = 0xff;
  auVar29[0xd] = 0xff;
  auVar29[0xe] = 0xff;
  auVar29[0xf] = 0xff;
  auVar29 = psllw(auVar29,8);
  iVar12 = width + -4;
  iVar13 = iVar12;
  if (3 < width) {
    do {
      auVar14 = *(undefined1 (*) [16])src_argb0;
      src_argb0 = (uint8_t *)((long)src_argb0 + 0x10);
      auVar21[0xb] = 0xff;
      auVar21._0_11_ = ZEXT811(0xff000000ff000000);
      auVar21._12_3_ = 0;
      auVar21[0xf] = 0xff;
      auVar21 = pshufb(auVar14 ^ auVar21,(undefined1  [16])libyuv::kShuffleAlpha);
      auVar16[8] = 0xff;
      auVar16._0_8_ = 0xff00ff00ff00ff;
      auVar16[9] = 0;
      auVar16[10] = 0xff;
      auVar16[0xb] = 0;
      auVar16[0xc] = 0xff;
      auVar16[0xd] = 0;
      auVar16[0xe] = 0xff;
      auVar16[0xf] = 0;
      auVar16 = *(undefined1 (*) [16])src_argb1 & auVar16;
      sVar20 = auVar21._0_2_ + 1;
      sVar22 = auVar21._2_2_ + 1;
      sVar23 = auVar21._4_2_ + 1;
      sVar24 = auVar21._6_2_ + 1;
      sVar25 = auVar21._8_2_ + 1;
      sVar26 = auVar21._10_2_ + 1;
      sVar27 = auVar21._12_2_ + 1;
      sVar28 = auVar21._14_2_ + 1;
      puVar4 = *(undefined1 (*) [16])src_argb1;
      puVar5 = *(undefined1 (*) [16])src_argb1;
      puVar6 = *(undefined1 (*) [16])src_argb1;
      puVar7 = *(undefined1 (*) [16])src_argb1;
      puVar8 = *(undefined1 (*) [16])src_argb1;
      puVar9 = *(undefined1 (*) [16])src_argb1;
      puVar10 = *(undefined1 (*) [16])src_argb1;
      puVar11 = *(undefined1 (*) [16])src_argb1;
      src_argb1 = (uint8_t *)((long)src_argb1 + 0x10);
      auVar2[0xb] = 0xff;
      auVar2._0_11_ = ZEXT811(0xff000000ff000000);
      auVar2._12_3_ = 0;
      auVar2[0xf] = 0xff;
      auVar15._0_2_ = (*(ushort *)puVar4 >> 8) * sVar20;
      auVar15._2_2_ = (*(ushort *)(puVar5 + 2) >> 8) * sVar22;
      auVar15._4_2_ = (*(ushort *)(puVar6 + 4) >> 8) * sVar23;
      auVar15._6_2_ = (*(ushort *)(puVar7 + 6) >> 8) * sVar24;
      auVar15._8_2_ = (*(ushort *)(puVar8 + 8) >> 8) * sVar25;
      auVar15._10_2_ = (*(ushort *)(puVar9 + 10) >> 8) * sVar26;
      auVar15._12_2_ = (*(ushort *)(puVar10 + 0xc) >> 8) * sVar27;
      auVar15._14_2_ = (*(ushort *)(puVar11 + 0xe) >> 8) * sVar28;
      auVar17._0_2_ = (ushort)(auVar16._0_2_ * sVar20) >> 8;
      auVar17._2_2_ = (ushort)(auVar16._2_2_ * sVar22) >> 8;
      auVar17._4_2_ = (ushort)(auVar16._4_2_ * sVar23) >> 8;
      auVar17._6_2_ = (ushort)(auVar16._6_2_ * sVar24) >> 8;
      auVar17._8_2_ = (ushort)(auVar16._8_2_ * sVar25) >> 8;
      auVar17._10_2_ = (ushort)(auVar16._10_2_ * sVar26) >> 8;
      auVar17._12_2_ = (ushort)(auVar16._12_2_ * sVar27) >> 8;
      auVar17._14_2_ = (ushort)(auVar16._14_2_ * sVar28) >> 8;
      auVar14 = paddusb(auVar14 | auVar2,auVar17);
      auVar14 = paddusb(auVar14,auVar15 & auVar29);
      *(undefined1 (*) [16])dst_argb = auVar14;
      dst_argb = (uint8_t *)((long)dst_argb + 0x10);
      iVar12 = iVar13 + -4;
      bVar1 = 3 < iVar13;
      iVar13 = iVar12;
    } while (bVar1);
  }
  iVar13 = iVar12 + 3;
  if (SCARRY4(iVar12,3) == iVar12 + 3 < 0) {
    do {
      puVar4 = *(undefined1 (*) [16])src_argb0;
      src_argb0 = *(undefined1 (*) [16])src_argb0 + 4;
      auVar14[0xb] = 0xff;
      auVar14._0_11_ = ZEXT811(0xff000000ff000000);
      auVar14._12_3_ = 0;
      auVar14[0xf] = 0xff;
      auVar14 = pshufb(ZEXT416(*(uint *)puVar4) ^ auVar14,(undefined1  [16])libyuv::kShuffleAlpha);
      auVar18[8] = 0xff;
      auVar18._0_8_ = 0xff00ff00ff00ff;
      auVar18[9] = 0;
      auVar18[10] = 0xff;
      auVar18[0xb] = 0;
      auVar18[0xc] = 0xff;
      auVar18[0xd] = 0;
      auVar18[0xe] = 0xff;
      auVar18[0xf] = 0;
      auVar18 = ZEXT416(*(uint *)*(undefined1 (*) [16])src_argb1) & auVar18;
      sVar20 = auVar14._0_2_ + 1;
      sVar22 = auVar14._2_2_ + 1;
      puVar5 = *(undefined1 (*) [16])src_argb1;
      src_argb1 = *(undefined1 (*) [16])src_argb1 + 4;
      auVar3[0xb] = 0xff;
      auVar3._0_11_ = ZEXT811(0xff000000ff000000);
      auVar3._12_3_ = 0;
      auVar3[0xf] = 0xff;
      auVar19._0_2_ = (ushort)(auVar18._0_2_ * sVar20) >> 8;
      auVar19._2_2_ = (ushort)(auVar18._2_2_ * sVar22) >> 8;
      auVar19._4_4_ = 0;
      auVar19._8_2_ = (ushort)(auVar18._8_2_ * (auVar14._8_2_ + 1)) >> 8;
      auVar19._10_2_ = (ushort)(auVar18._10_2_ * (auVar14._10_2_ + 1)) >> 8;
      auVar19._12_2_ = (ushort)(auVar18._12_2_ * (auVar14._12_2_ + 1)) >> 8;
      auVar19._14_2_ = (ushort)(auVar18._14_2_ * (auVar14._14_2_ + 1)) >> 8;
      auVar14 = paddusb(ZEXT416(*(uint *)puVar4) | auVar3,auVar19);
      auVar14 = paddusb(auVar14,ZEXT416(CONCAT22((ushort)((uint)*(undefined4 *)puVar5 >> 0x18) *
                                                 sVar22,((ushort)*(undefined4 *)puVar5 >> 8) *
                                                        sVar20)) & auVar29);
      *(int *)*(undefined1 (*) [16])dst_argb = auVar14._0_4_;
      dst_argb = *(undefined1 (*) [16])dst_argb + 4;
      bVar1 = 0 < iVar13;
      iVar13 = iVar13 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void ARGBBlendRow_SSSE3(const uint8_t* src_argb0,
                        const uint8_t* src_argb1,
                        uint8_t* dst_argb,
                        int width) {
  asm volatile(
      "pcmpeqb     %%xmm7,%%xmm7                 \n"
      "psrlw       $0xf,%%xmm7                   \n"
      "pcmpeqb     %%xmm6,%%xmm6                 \n"
      "psrlw       $0x8,%%xmm6                   \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psllw       $0x8,%%xmm5                   \n"
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "pslld       $0x18,%%xmm4                  \n"
      "sub         $0x4,%3                       \n"
      "jl          49f                           \n"

      // 4 pixel loop.
      LABELALIGN
      "40:                                       \n"
      "movdqu      (%0),%%xmm3                   \n"
      "lea         0x10(%0),%0                   \n"
      "movdqa      %%xmm3,%%xmm0                 \n"
      "pxor        %%xmm4,%%xmm3                 \n"
      "movdqu      (%1),%%xmm2                   \n"
      "pshufb      %4,%%xmm3                     \n"
      "pand        %%xmm6,%%xmm2                 \n"
      "paddw       %%xmm7,%%xmm3                 \n"
      "pmullw      %%xmm3,%%xmm2                 \n"
      "movdqu      (%1),%%xmm1                   \n"
      "lea         0x10(%1),%1                   \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "por         %%xmm4,%%xmm0                 \n"
      "pmullw      %%xmm3,%%xmm1                 \n"
      "psrlw       $0x8,%%xmm2                   \n"
      "paddusb     %%xmm2,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm1                 \n"
      "paddusb     %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%3                       \n"
      "jge         40b                           \n"

      "49:                                       \n"
      "add         $0x3,%3                       \n"
      "jl          99f                           \n"

      // 1 pixel loop.
      "91:                                       \n"
      "movd        (%0),%%xmm3                   \n"
      "lea         0x4(%0),%0                    \n"
      "movdqa      %%xmm3,%%xmm0                 \n"
      "pxor        %%xmm4,%%xmm3                 \n"
      "movd        (%1),%%xmm2                   \n"
      "pshufb      %4,%%xmm3                     \n"
      "pand        %%xmm6,%%xmm2                 \n"
      "paddw       %%xmm7,%%xmm3                 \n"
      "pmullw      %%xmm3,%%xmm2                 \n"
      "movd        (%1),%%xmm1                   \n"
      "lea         0x4(%1),%1                    \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "por         %%xmm4,%%xmm0                 \n"
      "pmullw      %%xmm3,%%xmm1                 \n"
      "psrlw       $0x8,%%xmm2                   \n"
      "paddusb     %%xmm2,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm1                 \n"
      "paddusb     %%xmm1,%%xmm0                 \n"
      "movd        %%xmm0,(%2)                   \n"
      "lea         0x4(%2),%2                    \n"
      "sub         $0x1,%3                       \n"
      "jge         91b                           \n"
      "99:                                       \n"
      : "+r"(src_argb0),    // %0
        "+r"(src_argb1),    // %1
        "+r"(dst_argb),     // %2
        "+r"(width)         // %3
      : "m"(kShuffleAlpha)  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}